

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	float a = 1.0f;
	float b = -1.0f;
	float c = 0.5f;
	float d = -0.5f;
	float e = 1.5f;
	float f = -1.5;

	std::cout << static_cast<int>(a) << std::endl;
	std::cout << static_cast<int>(b) << std::endl;
	std::cout << static_cast<int>(c) << std::endl;
	std::cout << static_cast<int>(d) << std::endl;
	std::cout << static_cast<int>(e) << std::endl;
	std::cout << static_cast<int>(f) << std::endl;
}